

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9Lf(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  Gia_Man_t *pNew;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  Jf_Par_t Pars;
  char Buffer [200];
  Jf_Par_t local_200;
  char local_f8 [200];
  
  Lf_ManSetDefaultPars(&local_200);
  Extra_UtilGetoptReset();
LAB_00283e6c:
  iVar1 = Extra_UtilGetopt(argc,argv,"KCFARLEDWMekmupstgvwh");
  iVar5 = globalUtilOptind;
  switch(iVar1) {
  case 0x61:
    local_200.fAreaOnly._0_1_ = (byte)local_200.fAreaOnly ^ 1;
    goto LAB_00283e6c;
  case 0x62:
  case 99:
  case 100:
  case 0x66:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6c:
  case 0x6e:
  case 0x6f:
  case 0x71:
  case 0x72:
    goto switchD_00283e88_caseD_62;
  case 0x65:
    local_200.fOptEdge = local_200.fOptEdge ^ 1;
    goto LAB_00283e6c;
  case 0x67:
    local_200.fCutGroup = local_200.fCutGroup ^ 1;
    goto LAB_00283e6c;
  case 0x6b:
    local_200.fCoarsen = local_200.fCoarsen ^ 1;
    goto LAB_00283e6c;
  case 0x6d:
    local_200.fCutMin = local_200.fCutMin ^ 1;
    goto LAB_00283e6c;
  case 0x70:
    local_200.fPower = local_200.fPower ^ 1;
    goto LAB_00283e6c;
  case 0x73:
    local_200.fPureAig = local_200.fPureAig ^ 1;
    goto LAB_00283e6c;
  case 0x74:
    local_200.fDoAverage = local_200.fDoAverage ^ 1;
    goto LAB_00283e6c;
  case 0x75:
    local_200.fUseMux7 = local_200.fUseMux7 ^ 1;
    goto LAB_00283e6c;
  case 0x76:
    local_200.fVerbose = local_200.fVerbose ^ 1;
    goto LAB_00283e6c;
  case 0x77:
    local_200.fVeryVerbose = local_200.fVeryVerbose ^ 1;
    goto LAB_00283e6c;
  }
  switch(iVar1) {
  case 0x41:
    if (argc <= globalUtilOptind) {
      pcVar4 = "Command line switch \"-A\" should be followed by a positive integer.\n";
      goto LAB_00284134;
    }
    uVar2 = atoi(argv[globalUtilOptind]);
    local_200.nRoundsEla = uVar2;
    break;
  case 0x42:
  case 0x47:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4e:
  case 0x4f:
  case 0x50:
  case 0x51:
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x56:
    goto switchD_00283e88_caseD_62;
  case 0x43:
    if (argc <= globalUtilOptind) {
      pcVar4 = "Command line switch \"-C\" should be followed by a positive integer.\n";
      goto LAB_00284134;
    }
    uVar2 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar5 + 1;
    local_200.nCutNum = uVar2;
    if (((int)uVar2 < 1) || (local_200.nCutNumMax < (int)uVar2)) {
      pcVar4 = "This number of cuts (%d) is not supported.\n";
      goto LAB_00284149;
    }
    goto LAB_00283e6c;
  case 0x44:
    if (argc <= globalUtilOptind) {
      pcVar4 = "Command line switch \"-D\" should be followed by a floating point number.\n";
      goto LAB_00284134;
    }
    local_200.DelayTarget = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar5 + 1;
    if (local_200.DelayTarget < 1) goto switchD_00283e88_caseD_62;
    goto LAB_00283e6c;
  case 0x45:
    if (argc <= globalUtilOptind) {
      pcVar4 = "Command line switch \"-E\" should be followed by a floating point number.\n";
      goto LAB_0028411a;
    }
    uVar2 = atoi(argv[globalUtilOptind]);
    local_200.nAreaTuner = uVar2;
    break;
  case 0x46:
    if (argc <= globalUtilOptind) {
      pcVar4 = "Command line switch \"-F\" should be followed by a positive integer.\n";
      goto LAB_00284134;
    }
    uVar2 = atoi(argv[globalUtilOptind]);
    local_200.nRounds = uVar2;
    break;
  case 0x4b:
    if (argc <= globalUtilOptind) {
      pcVar4 = "Command line switch \"-K\" should be followed by a positive integer.\n";
      goto LAB_00284134;
    }
    uVar2 = atoi(argv[globalUtilOptind]);
    local_200.nLutSize = uVar2;
LAB_00284047:
    globalUtilOptind = iVar5 + 1;
    if (((int)uVar2 < 2) || (local_200.nLutSizeMax < (int)uVar2)) {
      pcVar4 = "LUT size %d is not supported.\n";
LAB_00284149:
      globalUtilOptind = iVar5 + 1;
      Abc_Print(-1,pcVar4,(ulong)uVar2);
switchD_00283e88_caseD_62:
      if (local_200.DelayTarget == -1) {
        builtin_strncpy(local_f8 + 8,"sible",6);
        builtin_strncpy(local_f8,"best pos",8);
      }
      else {
        sprintf(local_f8,"%d");
      }
      Abc_Print(-2,"usage: &lf [-KCFARLEDM num] [-kmupstgvwh]\n");
      Abc_Print(-2,"\t           performs technology mapping of the network\n");
      Abc_Print(-2,"\t-K num   : LUT size for the mapping (2 <= K <= %d) [default = %d]\n",
                (ulong)(uint)local_200.nLutSizeMax,(ulong)(uint)local_200.nLutSize);
      Abc_Print(-2,"\t-C num   : the max number of priority cuts (1 <= C <= %d) [default = %d]\n",
                (ulong)(uint)local_200.nCutNumMax,(ulong)(uint)local_200.nCutNum);
      Abc_Print(-2,"\t-F num   : the number of area flow rounds [default = %d]\n",
                (ulong)(uint)local_200.nRounds);
      Abc_Print(-2,"\t-A num   : the number of exact area rounds [default = %d]\n",
                (ulong)(uint)local_200.nRoundsEla);
      Abc_Print(-2,"\t-R num   : the delay relaxation ratio (num >= 0) [default = %d]\n",
                (ulong)(uint)local_200.nRelaxRatio);
      Abc_Print(-2,
                "\t-L num   : the fanout limit for coarsening XOR/MUX (num >= 2) [default = %d]\n",
                (ulong)(uint)local_200.nCoarseLimit);
      Abc_Print(-2,
                "\t-E num   : the area/edge tradeoff parameter (0 <= num <= 100) [default = %d]\n",
                (ulong)(uint)local_200.nAreaTuner);
      Abc_Print(-2,"\t-D num   : sets the delay constraint for the mapping [default = %s]\n",
                local_f8);
      Abc_Print(-2,
                "\t-M num   : LUT size when cofactoring is performed (0 <= num <= 100) [default = %d]\n"
                ,(ulong)(uint)local_200.nLutSizeMux);
      pcVar3 = "yes";
      pcVar4 = "yes";
      if (local_200.fOptEdge == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-e       : toggles edge vs node minimization [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (local_200.fCoarsen == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-k       : toggles coarsening the subject graph [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (local_200.fCutMin == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-m       : toggles cut minimization [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (local_200.fUseMux7 == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-u       : toggles using additional MUXes [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (local_200.fPower == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-p       : toggles power-aware cut selection heuristics [default = %s]\n",
                pcVar4);
      pcVar4 = "yes";
      if (local_200.fPureAig == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-s       : toggles generating AIG without mapping [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (local_200.fDoAverage == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,
                "\t-t       : toggles optimizing average rather than maximum level [default = %s]\n"
                ,pcVar4);
      pcVar4 = "yes";
      if (local_200.fCutGroup == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-g       : toggles using cut splitting [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (local_200.fVerbose == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-v       : toggles verbose output [default = %s]\n",pcVar4);
      if (local_200.fVeryVerbose == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-w       : toggles very verbose output [default = %s]\n",pcVar3);
      pcVar4 = "\t-h       : prints the command usage\n";
      iVar5 = -2;
LAB_002843ff:
      Abc_Print(iVar5,pcVar4);
      return 1;
    }
    goto LAB_00283e6c;
  case 0x4c:
    if (argc <= globalUtilOptind) {
LAB_0028408e:
      pcVar4 = "Command line switch \"-R\" should be followed by a floating point number.\n";
LAB_0028411a:
      Abc_Print(1,pcVar4);
      return 0;
    }
    uVar2 = atoi(argv[globalUtilOptind]);
    local_200.nCoarseLimit = uVar2;
    break;
  case 0x4d:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      local_200.nLutSizeMux = uVar2;
      goto LAB_00284047;
    }
    pcVar4 = "Command line switch \"-M\" should be followed by a positive integer.\n";
LAB_00284134:
    Abc_Print(-1,pcVar4);
    goto switchD_00283e88_caseD_62;
  case 0x52:
    if (argc <= globalUtilOptind) goto LAB_0028408e;
    uVar2 = atoi(argv[globalUtilOptind]);
    local_200.nRelaxRatio = uVar2;
    break;
  case 0x57:
    if (argc <= globalUtilOptind) {
      pcVar4 = "Command line switch \"-W\" should be followed by a positive integer.\n";
      goto LAB_00284134;
    }
    uVar2 = atoi(argv[globalUtilOptind]);
    local_200.nVerbLimit = uVar2;
    break;
  default:
    if (iVar1 != -1) goto switchD_00283e88_caseD_62;
    if (pAbc->pGia == (Gia_Man_t *)0x0) {
      pcVar4 = "Empty GIA network.\n";
    }
    else if (pAbc->pGia->vMapping == (Vec_Int_t *)0x0) {
      if ((local_200.nLutSizeMux == 0) || (local_200.fUseMux7 == 0)) {
        if (local_200.fCutGroup != 0) {
          if (local_200.nLutSize - 7U < 0xfffffffd) {
            pcVar4 = "This feature works only for LUT size equal to 4, 5, and 6.\n";
            goto LAB_002844b7;
          }
          printf("Using cut grouping for %d-LUTs. Considering cuts up to %d.\n",
                 (ulong)(uint)local_200.nLutSize,(ulong)(local_200.nLutSize * 2 + 1));
          local_200.nLutSize = local_200.nLutSize * 2 + 1;
        }
        pNew = Lf_ManPerformMapping(pAbc->pGia,&local_200);
        if (pNew != (Gia_Man_t *)0x0) {
          Abc_FrameUpdateGia(pAbc,pNew);
          return 0;
        }
        pcVar4 = "Abc_CommandAbc9Lf(): Mapping into LUTs has failed.\n";
      }
      else {
        pcVar4 = "Flags \"-M\" and \"-u\" are incompatible.\n";
      }
    }
    else {
      pcVar4 = "Current AIG has mapping. Run \"&st\".\n";
    }
LAB_002844b7:
    iVar5 = -1;
    goto LAB_002843ff;
  }
  globalUtilOptind = iVar5 + 1;
  if ((int)uVar2 < 0) goto switchD_00283e88_caseD_62;
  goto LAB_00283e6c;
}

Assistant:

int Abc_CommandAbc9Lf( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    char Buffer[200];
    Jf_Par_t Pars, * pPars = &Pars;
    Gia_Man_t * pNew; int c;
    Lf_ManSetDefaultPars( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "KCFARLEDWMekmupstgvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nLutSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLutSize < 2 || pPars->nLutSize > pPars->nLutSizeMax )
            {
                Abc_Print( -1, "LUT size %d is not supported.\n", pPars->nLutSize );
                goto usage;
            }
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nCutNum = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nCutNum < 1 || pPars->nCutNum > pPars->nCutNumMax )
            {
                Abc_Print( -1, "This number of cuts (%d) is not supported.\n", pPars->nCutNum );
                goto usage;
            }
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nRounds = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRounds < 0 )
                goto usage;
            break;
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nRoundsEla = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRoundsEla < 0 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( 1, "Command line switch \"-R\" should be followed by a floating point number.\n" );
                return 0;
            }
            pPars->nRelaxRatio = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRelaxRatio < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( 1, "Command line switch \"-R\" should be followed by a floating point number.\n" );
                return 0;
            }
            pPars->nCoarseLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nCoarseLimit < 0 )
                goto usage;
            break;
        case 'E':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( 1, "Command line switch \"-E\" should be followed by a floating point number.\n" );
                return 0;
            }
            pPars->nAreaTuner = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nAreaTuner < 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by a floating point number.\n" );
                goto usage;
            }
            pPars->DelayTarget = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->DelayTarget <= 0.0 )
                goto usage;
            break;
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nVerbLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nVerbLimit < 0 )
                goto usage;
            break;
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nLutSizeMux = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLutSizeMux < 2 || pPars->nLutSizeMux > pPars->nLutSizeMax )
            {
                Abc_Print( -1, "LUT size %d is not supported.\n", pPars->nLutSizeMux );
                goto usage;
            }
            break;
        case 'a':
            pPars->fAreaOnly ^= 1;
            break;
        case 'e':
            pPars->fOptEdge ^= 1;
            break;
        case 'k':
            pPars->fCoarsen ^= 1;
            break;
        case 'm':
            pPars->fCutMin ^= 1;
            break;
        case 'u':
            pPars->fUseMux7 ^= 1;
            break;
        case 'p':
            pPars->fPower ^= 1;
            break;
        case 's':
            pPars->fPureAig ^= 1;
            break;
        case 't':
            pPars->fDoAverage ^= 1;
            break;
        case 'g':
            pPars->fCutGroup ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fVeryVerbose ^= 1;
            break;
        case 'h':
        default:
            goto usage;
        }
    }

    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Empty GIA network.\n" );
        return 1;
    }
    if ( Gia_ManHasMapping(pAbc->pGia) )
    {
        Abc_Print( -1, "Current AIG has mapping. Run \"&st\".\n" );
        return 1;
    }
    if ( pPars->nLutSizeMux && pPars->fUseMux7 )
    {
        Abc_Print( -1, "Flags \"-M\" and \"-u\" are incompatible.\n" );
        return 1;
    }
    if ( pPars->fCutGroup )
    {
        if ( pPars->nLutSize < 4 || pPars->nLutSize > 6 )
        {
            Abc_Print( -1, "This feature works only for LUT size equal to 4, 5, and 6.\n" );
            return 1;
        }
        printf( "Using cut grouping for %d-LUTs. Considering cuts up to %d.\n", pPars->nLutSize, 2*pPars->nLutSize + 1 );
        pPars->nLutSize = 2*pPars->nLutSize + 1;
    }
    pNew = Lf_ManPerformMapping( pAbc->pGia, pPars );
    if ( pNew == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Lf(): Mapping into LUTs has failed.\n" );
        return 1;
    }
    Abc_FrameUpdateGia( pAbc, pNew );
    return 0;

usage:
    if ( pPars->DelayTarget == -1 )
        sprintf(Buffer, "best possible" );
    else
        sprintf(Buffer, "%d", pPars->DelayTarget );
    Abc_Print( -2, "usage: &lf [-KCFARLEDM num] [-kmupstgvwh]\n" );
    Abc_Print( -2, "\t           performs technology mapping of the network\n" );
    Abc_Print( -2, "\t-K num   : LUT size for the mapping (2 <= K <= %d) [default = %d]\n", pPars->nLutSizeMax, pPars->nLutSize );
    Abc_Print( -2, "\t-C num   : the max number of priority cuts (1 <= C <= %d) [default = %d]\n", pPars->nCutNumMax, pPars->nCutNum );
    Abc_Print( -2, "\t-F num   : the number of area flow rounds [default = %d]\n", pPars->nRounds );
    Abc_Print( -2, "\t-A num   : the number of exact area rounds [default = %d]\n", pPars->nRoundsEla );
    Abc_Print( -2, "\t-R num   : the delay relaxation ratio (num >= 0) [default = %d]\n", pPars->nRelaxRatio );
    Abc_Print( -2, "\t-L num   : the fanout limit for coarsening XOR/MUX (num >= 2) [default = %d]\n", pPars->nCoarseLimit );
    Abc_Print( -2, "\t-E num   : the area/edge tradeoff parameter (0 <= num <= 100) [default = %d]\n", pPars->nAreaTuner );
    Abc_Print( -2, "\t-D num   : sets the delay constraint for the mapping [default = %s]\n", Buffer );
    Abc_Print( -2, "\t-M num   : LUT size when cofactoring is performed (0 <= num <= 100) [default = %d]\n", pPars->nLutSizeMux );
//    Abc_Print( -2, "\t-a       : toggles area-oriented mapping [default = %s]\n", pPars->fAreaOnly? "yes": "no" );
    Abc_Print( -2, "\t-e       : toggles edge vs node minimization [default = %s]\n", pPars->fOptEdge? "yes": "no" );
    Abc_Print( -2, "\t-k       : toggles coarsening the subject graph [default = %s]\n", pPars->fCoarsen? "yes": "no" );
    Abc_Print( -2, "\t-m       : toggles cut minimization [default = %s]\n", pPars->fCutMin? "yes": "no" );
    Abc_Print( -2, "\t-u       : toggles using additional MUXes [default = %s]\n", pPars->fUseMux7? "yes": "no" );
    Abc_Print( -2, "\t-p       : toggles power-aware cut selection heuristics [default = %s]\n", pPars->fPower? "yes": "no" );
    Abc_Print( -2, "\t-s       : toggles generating AIG without mapping [default = %s]\n", pPars->fPureAig? "yes": "no" );
    Abc_Print( -2, "\t-t       : toggles optimizing average rather than maximum level [default = %s]\n", pPars->fDoAverage? "yes": "no" );
    Abc_Print( -2, "\t-g       : toggles using cut splitting [default = %s]\n", pPars->fCutGroup? "yes": "no" );
    Abc_Print( -2, "\t-v       : toggles verbose output [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w       : toggles very verbose output [default = %s]\n", pPars->fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : prints the command usage\n");
    return 1;
}